

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sf::Image::create(Image *this,uint width,uint height,Color *color)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  size_type sVar1;
  reference pvVar2;
  value_type *in_RCX;
  int in_EDX;
  value_type *pvVar3;
  int in_ESI;
  int *in_RDI;
  Uint8 *end;
  Uint8 *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> newPixels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  reference local_50;
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  value_type *local_18;
  int local_10;
  int local_c;
  
  if ((in_ESI == 0) || (in_EDX == 0)) {
    memset(&stack0xffffffffffffff90,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x29bc38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff80);
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  else {
    __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
          (ulong)(uint)(in_ESI * in_EDX * 4);
    __a = &local_31;
    local_18 = in_RCX;
    local_10 = in_EDX;
    local_c = in_ESI;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x29bae6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_ffffffffffffff90,(size_type)in_RDI,__a);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x29bb06);
    local_50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_30,0);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_30);
    pvVar2 = local_50 + sVar1;
    while (local_50 < pvVar2) {
      *local_50 = *local_18;
      local_50[1] = local_18[1];
      pvVar3 = local_50 + 3;
      local_50[2] = local_18[2];
      local_50 = local_50 + 4;
      *pvVar3 = local_18[3];
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a,__x);
    *in_RDI = local_c;
    in_RDI[1] = local_10;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
  }
  return;
}

Assistant:

void Image::create(unsigned int width, unsigned int height, const Color& color)
{
    if (width && height)
    {
        // Create a new pixel buffer first for exception safety's sake
        std::vector<Uint8> newPixels(width * height * 4);
    
        // Fill it with the specified color
        Uint8* ptr = &newPixels[0];
        Uint8* end = ptr + newPixels.size();
        while (ptr < end)
        {
            *ptr++ = color.r;
            *ptr++ = color.g;
            *ptr++ = color.b;
            *ptr++ = color.a;
        }
    
        // Commit the new pixel buffer
        m_pixels.swap(newPixels);
        
        // Assign the new size
        m_size.x = width;
        m_size.y = height;
    }
    else
    {
        // Dump the pixel buffer
        std::vector<Uint8>().swap(m_pixels);
        
        // Assign the new size
        m_size.x = 0;
        m_size.y = 0;
    }
}